

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  convert_32s_PXCX p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  opj_image_comp_t *poVar6;
  long lVar7;
  size_t __size;
  OPJ_BYTE *pOVar8;
  OPJ_INT32 *pOVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  OPJ_INT32 OVar14;
  ulong uVar15;
  uint uVar16;
  undefined4 uVar17;
  long lVar18;
  OPJ_INT32 *planes [4];
  convert_32sXXx_C1R local_a0;
  OPJ_INT32 *local_58;
  long local_50 [4];
  
  poVar2 = image->comps;
  uVar10 = poVar2->prec;
  local_58 = poVar2->data;
  uVar11 = image->numcomps;
  uVar12 = (ulong)uVar11;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (uVar11 < 4) {
      imagetotif_cold_6();
      return 1;
    }
    uVar12 = 4;
    uVar17 = 5;
  }
  else {
    uVar17 = 1;
    if (2 < uVar11) {
      uVar12 = (ulong)uVar11;
      if (3 < uVar11) {
        uVar12 = 4;
      }
      uVar17 = 2;
    }
  }
  uVar11 = (uint)uVar12;
  uVar13 = 1;
  if (1 < uVar11) {
    OVar1 = poVar2->dx;
    uVar15 = 1;
    poVar6 = poVar2;
    do {
      uVar13 = uVar15;
      if ((((OVar1 != poVar6[1].dx) || (poVar2->dy != poVar6[1].dy)) || (uVar10 != poVar6[1].prec))
         || (poVar2->sgnd != poVar6[1].sgnd)) break;
      pOVar9 = poVar6[1].data;
      local_50[uVar15 - 1] = (long)pOVar9;
      if (pOVar9 == (OPJ_INT32 *)0x0) {
        imagetotif_cold_5();
        return 1;
      }
      uVar15 = uVar15 + 1;
      uVar13 = uVar12;
      poVar6 = poVar6 + 1;
    } while (uVar11 != (uint)uVar15);
  }
  if ((uint)uVar13 == uVar11) {
    uVar16 = 0;
    if ((uVar10 & 0xffff) < 0x11) {
      uVar16 = uVar10;
    }
    if ((short)uVar16 == 0) {
      imagetotif_cold_4();
    }
    else {
      lVar7 = TIFFOpen(outfile);
      if (lVar7 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
      }
      else {
        uVar16 = uVar16 & 0xffff;
        if (uVar12 != 0) {
          lVar18 = 0;
          do {
            clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar18),image->comps->prec
                          );
            lVar18 = lVar18 + 0x40;
          } while (uVar12 << 6 != lVar18);
        }
        OVar14 = 0;
        switch(uVar16) {
        case 1:
        case 2:
        case 4:
        case 6:
        case 8:
          local_a0 = convert_32sXXu_C1R_LUT[CONCAT44(0,uVar16)];
          break;
        case 3:
          local_a0 = tif_32sto3u;
          break;
        case 5:
          local_a0 = tif_32sto5u;
          break;
        case 7:
          local_a0 = tif_32sto7u;
          break;
        case 9:
          local_a0 = tif_32sto9u;
          break;
        case 10:
          local_a0 = tif_32sto10u;
          break;
        case 0xb:
          local_a0 = tif_32sto11u;
          break;
        case 0xc:
          local_a0 = tif_32sto12u;
          break;
        case 0xd:
          local_a0 = tif_32sto13u;
          break;
        case 0xe:
          local_a0 = tif_32sto14u;
          break;
        case 0xf:
          local_a0 = tif_32sto15u;
          break;
        case 0x10:
          local_a0 = tif_32sto16u;
          break;
        default:
          local_a0 = (convert_32sXXx_C1R)0x0;
        }
        poVar2 = image->comps;
        if (poVar2->sgnd != 0) {
          OVar14 = 1 << ((char)poVar2->prec - 1U & 0x1f);
        }
        p_Var3 = convert_32s_PXCX_LUT[uVar12];
        uVar10 = poVar2->w;
        uVar13 = (ulong)uVar10;
        OVar1 = poVar2->h;
        TIFFSetField(lVar7,0x100,uVar13);
        TIFFSetField(lVar7,0x101,OVar1);
        TIFFSetField(lVar7,0x115,uVar12);
        TIFFSetField(lVar7,0x102,uVar16);
        TIFFSetField(lVar7,0x112,1);
        TIFFSetField(lVar7,0x11c,1);
        TIFFSetField(lVar7,0x106,uVar17);
        TIFFSetField(lVar7,0x116,1);
        __size = TIFFStripSize(lVar7);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar12;
        if (uVar10 <= SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar4,0)) {
          uVar10 = uVar10 * uVar11;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = CONCAT44(0,uVar16);
          if ((uVar10 < 0x40000000) &&
             ((ulong)uVar10 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar5,0))) {
            if (__size != uVar10 * uVar16 + 7 >> 3) {
              imagetotif_cold_2();
              return 1;
            }
            pOVar8 = (OPJ_BYTE *)malloc(__size);
            if (pOVar8 != (OPJ_BYTE *)0x0) {
              pOVar9 = (OPJ_INT32 *)malloc(uVar12 * uVar13 * 4);
              if (pOVar9 != (OPJ_INT32 *)0x0) {
                if (image->comps->h != 0) {
                  uVar10 = 0;
                  lVar18 = uVar13 * 4;
                  do {
                    (*p_Var3)(&local_58,pOVar9,uVar13,OVar14);
                    (*local_a0)(pOVar9,pOVar8,uVar12 * uVar13);
                    TIFFWriteEncodedStrip(lVar7,uVar10,pOVar8,__size);
                    local_58 = local_58 + uVar13;
                    local_50[0] = local_50[0] + lVar18;
                    local_50[1] = local_50[1] + lVar18;
                    local_50[2] = local_50[2] + lVar18;
                    uVar10 = uVar10 + 1;
                  } while (uVar10 < image->comps->h);
                }
                _TIFFfree(pOVar8);
                TIFFClose(lVar7);
                free(pOVar9);
                return 0;
              }
              _TIFFfree(pOVar8);
            }
            TIFFClose(lVar7);
            return 1;
          }
        }
        imagetotif_cold_3();
      }
    }
  }
  else {
    imagetotif_cold_1();
  }
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
    TIFF *tif;
    tdata_t buf;
    uint32_t width, height;
    uint16_t bps, tiPhoto;
    int adjust, sgnd;
    int64_t strip_size, rowStride, TIFF_MAX;
    OPJ_UINT32 i, numcomps;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32 const* planes[4];
    convert_32s_PXCX cvtPxToCx = NULL;
    convert_32sXXx_C1R cvt32sToTif = NULL;

    bps = (uint16_t)image->comps[0].prec;
    planes[0] = image->comps[0].data;

    numcomps = image->numcomps;

    if (image->color_space == OPJ_CLRSPC_CMYK) {
        if (numcomps < 4U) {
            fprintf(stderr,
                    "imagetotif: CMYK images shall be composed of at least 4 planes.\n");
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
        tiPhoto = PHOTOMETRIC_SEPARATED;
        if (numcomps > 4U) {
            numcomps = 4U; /* Alpha not supported */
        }
    } else if (numcomps > 2U) {
        tiPhoto = PHOTOMETRIC_RGB;
        if (numcomps > 4U) {
            numcomps = 4U;
        }
    } else {
        tiPhoto = PHOTOMETRIC_MINISBLACK;
    }
    for (i = 1U; i < numcomps; ++i) {
        if (image->comps[0].dx != image->comps[i].dx) {
            break;
        }
        if (image->comps[0].dy != image->comps[i].dy) {
            break;
        }
        if (image->comps[0].prec != image->comps[i].prec) {
            break;
        }
        if (image->comps[0].sgnd != image->comps[i].sgnd) {
            break;
        }
        planes[i] = image->comps[i].data;
        if (planes[i] == NULL) {
            fprintf(stderr,
                    "imagetotif: planes[%d] == NULL.\n", i);
            fprintf(stderr, "\tAborting\n");
            return 1;
        }
    }
    if (i != numcomps) {
        fprintf(stderr,
                "imagetotif: All components shall have the same subsampling, same bit depth.\n");
        fprintf(stderr, "\tAborting\n");
        return 1;
    }

    if (bps > 16) {
        bps = 0;
    }
    if (bps == 0) {
        fprintf(stderr, "imagetotif: Bits=%d, Only 1 to 16 bits implemented\n", bps);
        fprintf(stderr, "\tAborting\n");
        return 1;
    }
    tif = TIFFOpen(outfile, "wb");
    if (!tif) {
        fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
        return 1;
    }
    for (i = 0U; i < numcomps; ++i) {
        clip_component(&(image->comps[i]), image->comps[0].prec);
    }
    cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
    switch (bps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
        break;
    case 3:
        cvt32sToTif = tif_32sto3u;
        break;
    case 5:
        cvt32sToTif = tif_32sto5u;
        break;
    case 7:
        cvt32sToTif = tif_32sto7u;
        break;
    case 9:
        cvt32sToTif = tif_32sto9u;
        break;
    case 10:
        cvt32sToTif = tif_32sto10u;
        break;
    case 11:
        cvt32sToTif = tif_32sto11u;
        break;
    case 12:
        cvt32sToTif = tif_32sto12u;
        break;
    case 13:
        cvt32sToTif = tif_32sto13u;
        break;
    case 14:
        cvt32sToTif = tif_32sto14u;
        break;
    case 15:
        cvt32sToTif = tif_32sto15u;
        break;
    case 16:
        cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
        break;
    default:
        /* never here */
        break;
    }
    sgnd = (int)image->comps[0].sgnd;
    adjust = sgnd ? (int)(1 << (image->comps[0].prec - 1)) : 0;
    width   = (uint32_t)image->comps[0].w;
    height  = (uint32_t)image->comps[0].h;

    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, (uint16_t)numcomps);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
    TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
    TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    strip_size = (int64_t)TIFFStripSize(tif);

    if ((int64_t)width > (int64_t)(TIFF_MAX / numcomps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / bps) ||
            (int64_t)(width * numcomps) > (int64_t)(TIFF_MAX / (int64_t)sizeof(
                        OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        TIFFClose(tif);
        return 1;
    }
    rowStride = (int64_t)((width * numcomps * bps + 7U) / 8U);
    if (rowStride != strip_size) {
        fprintf(stderr, "Invalid TIFF strip size\n");
        TIFFClose(tif);
        return 1;
    }
    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        return 1;
    }
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * width * numcomps);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        return 1;
    }

    for (i = 0; i < image->comps[0].h; ++i) {
        cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
        cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
        (void)TIFFWriteEncodedStrip(tif, i, (void*)buf, (tsize_t)strip_size);
        planes[0] += width;
        planes[1] += width;
        planes[2] += width;
        planes[3] += width;
    }
    _TIFFfree((void*)buf);
    TIFFClose(tif);
    free(buffer32s);

    return 0;
}